

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall
kratos::LatchVisitor::AssignedVarVisitor::visit(AssignedVarVisitor *this,AssignStmt *stmt)

{
  VarSlice *pVVar1;
  VarType VVar2;
  uint uVar3;
  int iVar4;
  Var **ppVVar5;
  undefined4 extraout_var;
  vector<kratos::Stmt*,std::allocator<kratos::Stmt*>> *this_00;
  VarSlice *slice;
  Var *left;
  AssignStmt *stmt_local;
  AssignedVarVisitor *this_local;
  
  left = (Var *)stmt;
  stmt_local = (AssignStmt *)this;
  ppVVar5 = AssignStmt::left(stmt);
  slice = (VarSlice *)*ppVVar5;
  VVar2 = Var::type((Var *)slice);
  pVVar1 = slice;
  if (VVar2 == Slice) {
    uVar3 = (*(slice->super_Var).super_IRNode._vptr_IRNode[0x2b])();
    if ((uVar3 & 1) != 0) {
      return;
    }
    iVar4 = (*(pVVar1->super_Var).super_IRNode._vptr_IRNode[0x29])();
    slice = (VarSlice *)CONCAT44(extraout_var,iVar4);
  }
  this_00 = (vector<kratos::Stmt*,std::allocator<kratos::Stmt*>> *)
            std::
            unordered_map<kratos::Var_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>_>
            ::operator[](&this->assigned_vars_,(key_type *)&slice);
  std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>::emplace_back<kratos::AssignStmt*&>
            (this_00,(AssignStmt **)&left);
  return;
}

Assistant:

void visit(AssignStmt* stmt) override {
            auto* left = stmt->left();
            if (left->type() == VarType::Slice) {
                auto* slice = reinterpret_cast<VarSlice*>(left);
                if (slice->sliced_by_var()) {
                    return;
                }
                left = const_cast<Var*>(slice->get_var_root_parent());
            }
            assigned_vars_[left].emplace_back(stmt);
        }